

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O1

TextureFormat deqp::gles3::Functional::FboTestUtil::getFramebufferReadFormat(TextureFormat *format)

{
  TextureChannelClass TVar1;
  ulong uVar2;
  ulong uVar3;
  
  TVar1 = tcu::getTextureChannelClass(format->type);
  if (TVar1 < TEXTURECHANNELCLASS_LAST) {
    uVar2 = *(ulong *)(&DAT_01c650f8 + (ulong)TVar1 * 8);
    uVar3 = 8;
  }
  else {
    uVar3 = 0x15;
    uVar2 = 0x2600000000;
  }
  return (TextureFormat)(uVar2 | uVar3);
}

Assistant:

tcu::TextureFormat getFramebufferReadFormat (const tcu::TextureFormat& format)
{
	switch (tcu::getTextureChannelClass(format.type))
	{
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
			return tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::FLOAT);

		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			return tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8);

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			return tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT32);

		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			return tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::SIGNED_INT32);

		default:
			DE_FATAL("Unknown format");
			return tcu::TextureFormat();
	}
}